

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  ulong uVar6;
  int i;
  char *pcVar7;
  SetKey<int,_Negation<int>_> *pSVar8;
  bool bVar9;
  float fVar10;
  pair<unsigned_long,_unsigned_long> pVar11;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  TypeParam ht_in;
  TypeParam ht_out;
  Hasher local_1f0;
  undefined1 local_1e0 [8];
  undefined8 *local_1d8;
  AssertHelper local_1d0;
  SetKey<int,_Negation<int>_> local_1c1;
  iterator local_1c0;
  undefined1 *local_178;
  undefined1 local_170 [16];
  undefined1 local_160 [28];
  float local_144;
  undefined1 local_140;
  undefined8 local_128;
  sparsetable<int,(unsigned_short)48,Alloc<int,unsigned_long,18446744073709551615ul>> local_120 [56]
  ;
  int *local_e8;
  undefined **local_d0;
  undefined1 local_c8 [152];
  
  local_1c0.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)0x0;
  local_1c0.pos.row_begin._M_current = local_1c0.pos.row_begin._M_current & 0xffffffff00000000;
  local_1e0 = (undefined1  [8])0x0;
  local_1d8 = (undefined8 *)((ulong)local_1d8 & 0xffffffff00000000);
  local_170._0_8_ = local_170._0_8_ & 0xffffffff00000000;
  local_170._8_8_ =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_d0 = &PTR__BaseHashtableInterface_00c231b8;
  pSVar8 = (SetKey<int,_Negation<int>_> *)&local_1d0;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_c8,0,(Hasher *)&local_1c0,(Hasher *)local_1e0,
                     (Negation<int> *)&local_1f0,pSVar8,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_170);
  local_d0 = &PTR__BaseHashtableInterface_00c23138;
  iVar4 = UniqueObjectHelper<int>(2000);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_c8);
  local_c8._60_4_ = -iVar4;
  local_c8[0x2a] = true;
  iVar4 = 1;
  do {
    iVar5 = UniqueObjectHelper<int>(iVar4);
    local_1c0.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)CONCAT44(local_1c0.ht._4_4_,iVar5);
    google::
    sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_c8,1);
    google::
    sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize((pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                       *)local_170,
                      (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)local_c8,(const_reference)&local_1c0);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 100);
  iVar4 = UniqueObjectHelper<int>(0x38);
  local_170._0_4_ = -iVar4;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_c8,(key_type *)local_170);
  iVar4 = UniqueObjectHelper<int>(0x16);
  local_170._0_4_ = -iVar4;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_c8,(key_type *)local_170);
  __stream = tmpfile();
  bVar9 = __stream != (FILE *)0x0;
  local_1c0.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1c0.ht._1_7_,bVar9);
  local_1c0.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  if (!bVar9) {
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_170,(internal *)&local_1c0,(AssertionResult *)"fp != __null","false",
               "true",(char *)pSVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4b8,(char *)local_170._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_170._0_8_ !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_160) {
      operator_delete((void *)local_170._0_8_);
    }
    if (local_1e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1e0 + 8))();
    }
  }
  iVar2._M_current = local_1c0.pos.row_begin._M_current;
  if (local_1c0.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_1c0.pos.row_begin._M_current)->group !=
        &((local_1c0.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_1c0.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar2._M_current);
  }
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_c8);
  bVar3 = google::
          sparsetable<int,(unsigned_short)48,Alloc<int,unsigned_long,18446744073709551615ul>>::
          serialize<ValueSerializer,_IO_FILE>
                    ((sparsetable<int,(unsigned_short)48,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)(local_c8 + 0x48));
  local_1c0.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1c0.ht._1_7_,bVar3);
  local_1c0.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_170,(internal *)&local_1c0,
               (AssertionResult *)"ht_out.serialize(ValueSerializer(), fp)","false","true",
               (char *)pSVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4b9,(char *)local_170._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if ((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_170._0_8_ !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_160) {
      operator_delete((void *)local_170._0_8_);
    }
    if (local_1e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1e0 + 8))();
    }
  }
  iVar2._M_current = local_1c0.pos.row_begin._M_current;
  if (local_1c0.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_1c0.pos.row_begin._M_current)->group !=
        &((local_1c0.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_1c0.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar2._M_current);
  }
  rewind(__stream);
  local_1e0 = (undefined1  [8])0x0;
  local_1d8 = (undefined8 *)((ulong)local_1d8 & 0xffffffff00000000);
  local_1f0._0_8_ = (AssertHelperData *)0x0;
  local_1f0.num_compares_ = 0;
  local_1c0.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)((ulong)local_1c0.ht & 0xffffffff00000000);
  local_1c0.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  this_00 = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)(local_170 + 8);
  local_170._0_8_ = &PTR__BaseHashtableInterface_00c231b8;
  pSVar8 = &local_1c1;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(this_00,0,(Hasher *)local_1e0,&local_1f0,(Negation<int> *)&local_1d0,pSVar8,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_1c0);
  local_170._0_8_ = &PTR__BaseHashtableInterface_00c23138;
  local_1e0[0] = (internal)bVar9;
  local_1d8 = (undefined8 *)0x0;
  if (__stream == (FILE *)0x0) {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1c0,(internal *)local_1e0,(AssertionResult *)"fp != __null","false",
               "true",(char *)pSVar8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4bd,(char *)local_1c0.ht);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1c0.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1c0.pos.row_end) {
      operator_delete(local_1c0.ht);
    }
    if ((AssertHelperData *)local_1f0._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_1f0._0_8_ + 8))();
    }
  }
  puVar1 = local_1d8;
  if (local_1d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1d8 != local_1d8 + 2) {
      operator_delete((undefined8 *)*local_1d8);
    }
    operator_delete(puVar1);
  }
  local_128._0_4_ = 0;
  local_128._4_4_ = 0;
  bVar9 = google::
          sparsetable<int,(unsigned_short)48,Alloc<int,unsigned_long,18446744073709551615ul>>::
          unserialize<ValueSerializer,_IO_FILE>(local_120,__stream);
  fVar10 = (float)local_160._24_4_ * (float)local_e8;
  uVar6 = (ulong)fVar10;
  local_160._8_8_ = (long)(fVar10 - 9.223372e+18) & (long)uVar6 >> 0x3f | uVar6;
  local_144 = (float)local_e8 * local_144;
  uVar6 = (ulong)local_144;
  local_160._16_8_ = (long)(local_144 - 9.223372e+18) & (long)uVar6 >> 0x3f | uVar6;
  local_140 = 0;
  local_1e0[0] = (internal)bVar9;
  local_1d8 = (undefined8 *)0x0;
  if (!bVar9) {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1c0,(internal *)local_1e0,
               (AssertionResult *)"ht_in.unserialize(ValueSerializer(), fp)","false","true",
               (char *)pSVar8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4be,(char *)local_1c0.ht);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1c0.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1c0.pos.row_end) {
      operator_delete(local_1c0.ht);
    }
    if ((AssertHelperData *)local_1f0._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_1f0._0_8_ + 8))();
    }
  }
  puVar1 = local_1d8;
  if (local_1d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1d8 != local_1d8 + 2) {
      operator_delete((undefined8 *)*local_1d8);
    }
    operator_delete(puVar1);
  }
  fclose(__stream);
  iVar4 = UniqueObjectHelper<int>(1);
  local_1f0.id_ = iVar4;
  local_1d0.data_._0_4_ = UniqueObjectHelper<int>(1);
  local_1d0.data_._0_4_ = -(int)local_1d0.data_;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>(&local_1c0,this_00,(int *)&local_1d0);
  local_178 = local_170;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1e0,"this->UniqueObject(1)","*ht_in.find(this->UniqueKey(1))",
             &local_1f0.id_,local_1c0.pos.col_current);
  if (local_1e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if (local_1d8 == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (char *)*local_1d8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c1,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1c0.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> + 8))();
    }
  }
  puVar1 = local_1d8;
  if (local_1d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1d8 != local_1d8 + 2) {
      operator_delete((undefined8 *)*local_1d8);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(99);
  local_1f0.id_ = iVar4;
  local_1d0.data_._0_4_ = UniqueObjectHelper<int>(99);
  local_1d0.data_._0_4_ = -(int)local_1d0.data_;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>(&local_1c0,this_00,(int *)&local_1d0);
  local_178 = local_170;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1e0,"this->UniqueObject(99)","*ht_in.find(this->UniqueKey(99))",
             &local_1f0.id_,local_1c0.pos.col_current);
  if (local_1e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if (local_1d8 == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (char *)*local_1d8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c2,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1c0.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> + 8))();
    }
  }
  puVar1 = local_1d8;
  if (local_1d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1d8 != local_1d8 + 2) {
      operator_delete((undefined8 *)*local_1d8);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(100);
  local_1c0.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1c0.ht._4_4_,-iVar4);
  pVar11 = google::
           sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(this_00,(int *)&local_1c0);
  bVar9 = pVar11.first == 0xffffffffffffffff;
  local_1e0[0] = (internal)bVar9;
  local_1d8 = (undefined8 *)0x0;
  if (!bVar9) {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1c0,(internal *)local_1e0,
               (AssertionResult *)"ht_in.count(this->UniqueKey(100))","true","false",(char *)pSVar8)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c3,(char *)local_1c0.ht);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1c0.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1c0.pos.row_end) {
      operator_delete(local_1c0.ht);
    }
    if ((AssertHelperData *)local_1f0._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_1f0._0_8_ + 8))();
    }
  }
  puVar1 = local_1d8;
  if (local_1d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1d8 != local_1d8 + 2) {
      operator_delete((undefined8 *)*local_1d8);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(0x15);
  local_1f0.id_ = iVar4;
  local_1d0.data_._0_4_ = UniqueObjectHelper<int>(0x15);
  local_1d0.data_._0_4_ = -(int)local_1d0.data_;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>(&local_1c0,this_00,(int *)&local_1d0);
  local_178 = local_170;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1e0,"this->UniqueObject(21)","*ht_in.find(this->UniqueKey(21))",
             &local_1f0.id_,local_1c0.pos.col_current);
  if (local_1e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if (local_1d8 == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (char *)*local_1d8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c4,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1c0.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1c0.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> + 8))();
    }
  }
  puVar1 = local_1d8;
  if (local_1d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1d8 != local_1d8 + 2) {
      operator_delete((undefined8 *)*local_1d8);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(0x16);
  local_1c0.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1c0.ht._4_4_,-iVar4);
  pVar11 = google::
           sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(this_00,(int *)&local_1c0);
  bVar9 = pVar11.first == 0xffffffffffffffff;
  local_1e0[0] = (internal)bVar9;
  local_1d8 = (undefined8 *)0x0;
  if (!bVar9) {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1c0,(internal *)local_1e0,
               (AssertionResult *)"ht_in.count(this->UniqueKey(22))","true","false",(char *)pSVar8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c6,(char *)local_1c0.ht);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1c0.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1c0.pos.row_end) {
      operator_delete(local_1c0.ht);
    }
    if ((AssertHelperData *)local_1f0._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_1f0._0_8_ + 8))();
    }
  }
  puVar1 = local_1d8;
  if (local_1d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1d8 != local_1d8 + 2) {
      operator_delete((undefined8 *)*local_1d8);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(0x38);
  local_1c0.ht = (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1c0.ht._4_4_,-iVar4);
  pVar11 = google::
           sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(this_00,(int *)&local_1c0);
  bVar9 = pVar11.first == 0xffffffffffffffff;
  local_1e0[0] = (internal)bVar9;
  local_1d8 = (undefined8 *)0x0;
  if (!bVar9) {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1c0,(internal *)local_1e0,
               (AssertionResult *)"ht_in.count(this->UniqueKey(56))","true","false",(char *)pSVar8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c7,(char *)local_1c0.ht);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1c0.ht !=
        (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1c0.pos.row_end) {
      operator_delete(local_1c0.ht);
    }
    if ((AssertHelperData *)local_1f0._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_1f0._0_8_ + 8))();
    }
  }
  puVar1 = local_1d8;
  if (local_1d8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1d8 != local_1d8 + 2) {
      operator_delete((undefined8 *)*local_1d8);
    }
    operator_delete(puVar1);
  }
  local_170._0_8_ = &PTR__BaseHashtableInterface_00c231b8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector((vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             *)local_120);
  local_d0 = &PTR__BaseHashtableInterface_00c231b8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector((vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             *)(local_c8 + 0x48));
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Serialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(ValueSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(ValueSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}